

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

enable_if_t<std::is_base_of<interface_type,_std::decay_t<Impl1>_>::value,_void> __thiscall
poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::push_back<Impl1>
          (vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *this,
          Impl1 *obj)

{
  bool bVar1;
  
  bVar1 = can_construct_new_elem(this,0x30,8);
  if (bVar1) {
    vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
    push_back_new_elem<Impl1,Impl1>();
    return;
  }
  vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
  push_back_new_elem_w_storage_increase<Impl1,Impl1>
            ((vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *)this,obj);
  return;
}

Assistant:

inline auto vector<I, A, C>::push_back(T&& obj)
    -> std::enable_if_t<std::is_base_of<interface_type, std::decay_t<T>>::value>
{
    using TT         = std::decay_t<T>;
    constexpr auto s = sizeof(TT);
    constexpr auto a = alignof(TT);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<TT> {}, std::forward<T>(obj));
    } else {
        push_back_new_elem(type_tag<TT> {}, std::forward<T>(obj));
    }
}